

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O2

void __thiscall random_tests::stdrandom_test::test_method(stdrandom_test *this)

{
  long lVar1;
  check_type cVar2;
  int iVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  initializer_list<int> __l;
  const_string file_01;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  assertion_result local_1a8;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  int local_16c;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  vector<int,_std::allocator<int>_> test;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  uniform_int_distribution<int> distribution;
  lazy_ostream local_e8;
  undefined1 *local_d8;
  char **ppcStack_d0;
  undefined8 local_c8;
  FastRandomContext ctx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&ctx,false);
  distribution._M_param._M_a = 3;
  distribution._M_param._M_b = 9;
  for (iVar3 = 0; iVar3 != 100; iVar3 = iVar3 + 1) {
    cVar2 = std::uniform_int_distribution<int>::operator()(&distribution,&ctx);
    local_100 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
    ;
    local_f8 = "";
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0xc9;
    file.m_begin = (iterator)&local_100;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_110,msg);
    test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_1_ = 2 < (int)cVar2;
    test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1a8._0_8_ = "x >= 3";
    local_1a8.m_message.px = (element_type *)0xbb85fb;
    local_e8._8_8_ = local_e8._8_8_ & 0xffffffffffffff00;
    local_e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_d8 = boost::unit_test::lazy_ostream::inst;
    ppcStack_d0 = (char **)&local_1a8;
    local_138 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
    ;
    local_130 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&test,&local_e8,1,0,WARN,CONCAT44(iVar3,cVar2),(size_t)&local_138
               ,0xc9);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    local_148 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
    ;
    local_140 = "";
    local_158 = &boost::unit_test::basic_cstring<char_const>::null;
    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    file_00.m_end = (iterator)0xca;
    file_00.m_begin = (iterator)&local_148;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_158,
               msg_00);
    test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_1_ = (int)cVar2 < 10;
    test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1a8._0_8_ = "x <= 9";
    local_1a8.m_message.px = (element_type *)0xbb8602;
    local_e8._8_8_ = local_e8._8_8_ & 0xffffffffffffff00;
    local_e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_d8 = boost::unit_test::lazy_ostream::inst;
    ppcStack_d0 = (char **)&local_1a8;
    local_168 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
    ;
    local_160 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&test,&local_e8,1,0,WARN,CONCAT44(iVar3,cVar2),(size_t)&local_168
               ,0xca);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    local_d8 = (undefined1 *)0x600000005;
    ppcStack_d0 = (char **)0x800000007;
    local_e8._vptr_lazy_ostream = (_func_int **)0x200000001;
    local_e8._8_8_ = 0x400000003;
    local_c8 = 0xa00000009;
    __l._M_len = 10;
    __l._M_array = (iterator)&local_e8;
    std::vector<int,_std::allocator<int>_>::vector(&test,__l,(allocator_type *)&local_1a8);
    _Var4._M_current._1_7_ =
         test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         ._1_7_;
    _Var4._M_current._0_1_ =
         test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         ._0_1_;
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,FastRandomContext&>
              (_Var4,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     test.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&ctx);
    for (local_16c = 1; local_16c < 0xb; local_16c = local_16c + 1) {
      local_180 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_178 = "";
      local_190 = &boost::unit_test::basic_cstring<char_const>::null;
      local_188 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_01.m_end = in_R9;
      msg_01.m_begin = in_R8;
      file_01.m_end = (iterator)0xcf;
      file_01.m_begin = (iterator)&local_180;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_190,
                 msg_01);
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (CONCAT71(test.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._1_7_,
                                  test.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_1_),
                         test.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_16c);
      local_1a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)
           (_Var4._M_current !=
           test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish);
      local_1a8.m_message.px = (element_type *)0x0;
      local_1a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1b8 = "std::find(test.begin(), test.end(), j) != test.end()";
      local_1b0 = "";
      local_e8._8_8_ = local_e8._8_8_ & 0xffffffffffffff00;
      local_e8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
      local_d8 = boost::unit_test::lazy_ostream::inst;
      ppcStack_d0 = &local_1b8;
      local_1c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/random_tests.cpp"
      ;
      local_1c0 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_1a8,&local_e8,1,0,WARN,CONCAT44(iVar3,cVar2),(size_t)&local_1c8,0xcf);
      boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&test);
  }
  ChaCha20::~ChaCha20(&ctx.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(stdrandom_test)
{
    FastRandomContext ctx;
    std::uniform_int_distribution<int> distribution(3, 9);
    for (int i = 0; i < 100; ++i) {
        int x = distribution(ctx);
        BOOST_CHECK(x >= 3);
        BOOST_CHECK(x <= 9);

        std::vector<int> test{1, 2, 3, 4, 5, 6, 7, 8, 9, 10};
        std::shuffle(test.begin(), test.end(), ctx);
        for (int j = 1; j <= 10; ++j) {
            BOOST_CHECK(std::find(test.begin(), test.end(), j) != test.end());
        }
    }
}